

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O3

void GetEntropyUnrefined_C(uint32_t *X,int length,VP8LBitEntropy *bit_entropy,VP8LStreaks *stats)

{
  int *piVar1;
  uint32_t uVar2;
  bool bVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint32_t uVar12;
  int iVar13;
  uint64_t uVar14;
  uint32_t uVar15;
  bool bVar16;
  
  uVar15 = *X;
  uVar10 = 0;
  stats->streaks[1] = (int  [2])0x0;
  stats->counts[0] = 0;
  stats->counts[1] = 0;
  stats->streaks[0] = (int  [2])0x0;
  bit_entropy->sum = 0;
  bit_entropy->nonzeros = 0;
  bit_entropy->max_val = 0;
  bit_entropy->nonzero_code = 0xffffffff;
  if (length < 2) {
    uVar14 = 0;
    iVar13 = 0;
    uVar9 = 0;
    uVar12 = 0;
    length = 1;
  }
  else {
    uVar7 = 1;
    uVar10 = 0;
    uVar14 = 0;
    uVar11 = 0;
    uVar9 = 0;
    uVar12 = 0;
    do {
      uVar2 = X[uVar7];
      if (uVar2 != uVar15) {
        uVar4 = (uint32_t)uVar7;
        iVar13 = -uVar12 + uVar4;
        if (uVar15 != 0) {
          uVar8 = (int)uVar9 + iVar13 * uVar15;
          bit_entropy->sum = uVar8;
          uVar11 = (uVar11 & 0xffffffff) + uVar7 + (ulong)-uVar12;
          bit_entropy->nonzeros = (int)uVar11;
          bit_entropy->nonzero_code = uVar12;
          if (uVar15 < 0x100) {
            uVar5 = kSLog2Table[uVar15];
          }
          else {
            uVar5 = (*VP8LFastSLog2Slow)(uVar15);
          }
          uVar9 = (ulong)uVar8;
          uVar14 = uVar14 + (uVar7 - (long)(int)uVar12) * uVar5;
          bit_entropy->entropy = uVar14;
          if (uVar10 < uVar15) {
            bit_entropy->max_val = uVar15;
            uVar10 = uVar15;
          }
        }
        bVar3 = 3 < iVar13;
        bVar16 = uVar15 != 0;
        stats->counts[bVar16] = stats->counts[bVar16] + (uint)bVar3;
        stats->streaks[bVar16][bVar3] = (stats->streaks[bVar16][bVar3] - uVar12) + uVar4;
        uVar15 = uVar2;
        uVar12 = uVar4;
      }
      iVar13 = (int)uVar11;
      uVar7 = uVar7 + 1;
    } while ((uint)length != uVar7);
  }
  iVar6 = length - uVar12;
  if (uVar15 != 0) {
    uVar8 = (int)uVar9 + iVar6 * uVar15;
    bit_entropy->sum = uVar8;
    bit_entropy->nonzeros = iVar13 + iVar6;
    bit_entropy->nonzero_code = uVar12;
    if (uVar15 < 0x100) {
      uVar5 = kSLog2Table[uVar15];
    }
    else {
      uVar5 = (*VP8LFastSLog2Slow)(uVar15);
    }
    uVar9 = (ulong)uVar8;
    uVar14 = uVar14 + (long)iVar6 * uVar5;
    if (uVar10 < uVar15) {
      bit_entropy->max_val = uVar15;
    }
  }
  stats->counts[uVar15 != 0] = stats->counts[uVar15 != 0] + (uint)(3 < iVar6);
  piVar1 = stats->streaks[uVar15 != 0] + (3 < iVar6);
  *piVar1 = *piVar1 + iVar6;
  if ((uint)uVar9 < 0x100) {
    uVar5 = kSLog2Table[uVar9];
  }
  else {
    uVar5 = (*VP8LFastSLog2Slow)((uint)uVar9);
  }
  bit_entropy->entropy = uVar5 - uVar14;
  return;
}

Assistant:

static void GetEntropyUnrefined_C(
    const uint32_t X[], int length,
    VP8LBitEntropy* WEBP_RESTRICT const bit_entropy,
    VP8LStreaks* WEBP_RESTRICT const stats) {
  int i;
  int i_prev = 0;
  uint32_t x_prev = X[0];

  memset(stats, 0, sizeof(*stats));
  VP8LBitEntropyInit(bit_entropy);

  for (i = 1; i < length; ++i) {
    const uint32_t x = X[i];
    if (x != x_prev) {
      GetEntropyUnrefinedHelper(x, i, &x_prev, &i_prev, bit_entropy, stats);
    }
  }
  GetEntropyUnrefinedHelper(0, i, &x_prev, &i_prev, bit_entropy, stats);

  bit_entropy->entropy = VP8LFastSLog2(bit_entropy->sum) - bit_entropy->entropy;
}